

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void checkPropertyConsistency<char_const*>
               (cmGeneratorTarget *depender,cmGeneratorTarget *dependee,string *propName,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emitted,string *config,CompatibleType t,char **param_7)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  cmLocalGenerator *this;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  string_view sVar5;
  undefined1 auVar6 [16];
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  string local_320;
  undefined1 local_300 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string pfile;
  undefined1 local_138 [8];
  string pname;
  string *p;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmAlphaNum local_b8;
  undefined1 local_88 [8];
  string pdir;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  cmValue prop;
  CompatibleType t_local;
  string *config_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *emitted_local;
  string *propName_local;
  cmGeneratorTarget *dependee_local;
  cmGeneratorTarget *depender_local;
  
  props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)cmGeneratorTarget::GetProperty(dependee,propName);
  bVar1 = cmValue::operator_cast_to_bool
                    ((cmValue *)
                     &props.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_
                       ((cmValue *)
                        &props.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar5 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    pdir.field_2._8_8_ = sVar5._M_len;
    _Var4._M_node = (_Base_ptr)0x0;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_58,sVar5,false);
    psVar2 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    cmAlphaNum::cmAlphaNum(&local_b8,psVar2);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range1,"/Help/prop_tgt/");
    cmStrCat<>((string *)local_88,&local_b8,(cmAlphaNum *)&__range1);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_58);
    p = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&p), bVar1) {
      pname.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)pname.field_2._8_8_);
      sVar5._M_len = auVar6._8_8_;
      pfile.field_2._8_8_ = auVar6._0_8_;
      sVar5._M_str = (char *)_Var4._M_node;
      cmSystemTools::HelpFileName_abi_cxx11_
                ((string *)local_138,(cmSystemTools *)pfile.field_2._8_8_,sVar5);
      std::operator+(&local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     &local_188,".rst");
      std::__cxx11::string::~string((string *)&local_188);
      bVar1 = cmsys::SystemTools::FileExists((string *)local_168,true);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
        poVar3 = std::operator<<((ostream *)local_300,"Target \"");
        psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
        poVar3 = std::operator<<(poVar3,(string *)psVar2);
        poVar3 = std::operator<<(poVar3,"\" has property \"");
        poVar3 = std::operator<<(poVar3,(string *)pname.field_2._8_8_);
        poVar3 = std::operator<<(poVar3,"\" listed in its ");
        poVar3 = std::operator<<(poVar3,(string *)propName);
        poVar3 = std::operator<<(poVar3,
                                 " property.  This is not allowed.  Only user-defined properties may appear listed in the "
                                );
        poVar3 = std::operator<<(poVar3,(string *)propName);
        std::operator<<(poVar3," property.");
        this = cmGeneratorTarget::GetLocalGenerator(depender);
        std::__cxx11::ostringstream::str();
        cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_320);
        std::__cxx11::string::~string((string *)&local_320);
        bVar1 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
      }
      else {
        pVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(emitted,(value_type *)pname.field_2._8_8_);
        _Var4 = pVar7.first._M_node;
        if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          _Var4._M_node = (_Base_ptr)(ulong)t;
          getLinkInterfaceDependentProperty<char_const*>
                    (depender,(string *)pname.field_2._8_8_,config,t,(char **)0x0);
          bVar1 = cmSystemTools::GetErrorOccurredFlag();
          if (bVar1) {
            bVar1 = true;
            goto LAB_008426a8;
          }
        }
        bVar1 = false;
      }
LAB_008426a8:
      std::__cxx11::string::~string((string *)local_168);
      std::__cxx11::string::~string((string *)local_138);
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::string::~string((string *)local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
  }
  return;
}

Assistant:

void checkPropertyConsistency(cmGeneratorTarget const* depender,
                              cmGeneratorTarget const* dependee,
                              const std::string& propName,
                              std::set<std::string>& emitted,
                              const std::string& config, CompatibleType t,
                              PropertyType* /*unused*/)
{
  cmValue prop = dependee->GetProperty(propName);
  if (!prop) {
    return;
  }

  std::vector<std::string> props = cmExpandedList(*prop);
  std::string pdir =
    cmStrCat(cmSystemTools::GetCMakeRoot(), "/Help/prop_tgt/");

  for (std::string const& p : props) {
    std::string pname = cmSystemTools::HelpFileName(p);
    std::string pfile = pdir + pname + ".rst";
    if (cmSystemTools::FileExists(pfile, true)) {
      std::ostringstream e;
      e << "Target \"" << dependee->GetName() << "\" has property \"" << p
        << "\" listed in its " << propName
        << " property.  "
           "This is not allowed.  Only user-defined properties may appear "
           "listed in the "
        << propName << " property.";
      depender->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                                  e.str());
      return;
    }
    if (emitted.insert(p).second) {
      getLinkInterfaceDependentProperty<PropertyType>(depender, p, config, t,
                                                      nullptr);
      if (cmSystemTools::GetErrorOccurredFlag()) {
        return;
      }
    }
  }
}